

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

bool __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
::has_next(Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
           *this,bool all_cofacets)

{
  int iVar1;
  Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *pCVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  vertex_t vVar6;
  vertex_t vVar7;
  reference __x;
  reference __y;
  reference pvVar8;
  value_type *pvVar9;
  reference __x_00;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  *__x_01;
  vertex_diameter_t *o;
  reference pvVar10;
  uint *puVar11;
  simplex_t *psVar12;
  simplex_t *psVar13;
  long extraout_RDX;
  long extraout_RDX_00;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  local_48;
  value_type end;
  value_type *it;
  size_t idx;
  value_type *end0;
  value_type *it0;
  bool all_cofacets_local;
  Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
  *this_local;
  
  __x = std::
        vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
        ::operator[](&this->neighbor_it,0);
  __y = std::
        vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
        ::operator[](&this->neighbor_end,0);
  do {
    bVar5 = std::operator!=(__x,__y);
    if (!bVar5) {
      return false;
    }
    pvVar8 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
             ::operator*(__x);
    Sparse_distance_matrix<Params>::vertex_diameter_t::operator=(&this->neighbor,pvVar8);
    it = (value_type *)0x1;
    while( true ) {
      pvVar9 = (value_type *)
               std::
               vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
               ::size(&this->neighbor_it);
      if (pvVar9 <= it) {
        while( true ) {
          bVar5 = false;
          if ('\0' < this->k) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&this->vertices,(long)(this->k + -1));
            iVar1 = *pvVar10;
            vVar6 = get_vertex(&this->neighbor);
            bVar5 = vVar6 < iVar1;
          }
          if (!bVar5) break;
          if (!all_cofacets) {
            return false;
          }
          pCVar2 = this->simplex_encoding;
          puVar11 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                      (&this->vertices,(long)(this->k + -1));
          psVar12 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::
                    operator()((simplex_t *)pCVar2,
                               (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                                *)(ulong)*puVar11,(int)this->k,(dimension_t)puVar11);
          psVar13 = *(simplex_t **)&this->idx_below;
          lVar3 = *(long *)((long)&this->idx_below + 8);
          *(long *)&this->idx_below = (long)psVar13 - (long)psVar12;
          *(ulong *)((long)&this->idx_below + 8) =
               (lVar3 - extraout_RDX) - (ulong)(psVar13 < psVar12);
          pCVar2 = this->simplex_encoding;
          puVar11 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                      (&this->vertices,(long)(this->k + -1));
          psVar13 = Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::
                    operator()((simplex_t *)pCVar2,
                               (Cns_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                                *)(ulong)*puVar11,
                               (int)(char)((char)*(undefined4 *)&this->k + '\x01'),
                               (dimension_t)puVar11);
          uVar4 = (ulong)this->idx_above;
          lVar3 = *(long *)((long)&this->idx_above + 8);
          *(ulong *)&this->idx_above = uVar4 + (long)psVar13;
          *(ulong *)((long)&this->idx_above + 8) =
               lVar3 + extraout_RDX_00 + (ulong)CARRY8(uVar4,(ulong)psVar13);
          this->k = this->k + -1;
        }
        return true;
      }
      end.current._M_current =
           (__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>
            )std::
             vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
             ::operator[](&this->neighbor_it,(size_type)it);
      __x_00 = std::
               vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
               ::operator[](&this->neighbor_end,(size_type)it);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
      ::reverse_iterator(&local_48,__x_00);
      while( true ) {
        pvVar8 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                              *)end.current._M_current);
        vVar6 = get_vertex(pvVar8);
        vVar7 = get_vertex(&this->neighbor);
        if (vVar6 <= vVar7) break;
        __x_01 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                 ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                               *)end.current._M_current);
        bVar5 = std::operator==(__x_01,&local_48);
        if (bVar5) {
          return false;
        }
      }
      pvVar8 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                            *)end.current._M_current);
      vVar6 = get_vertex(pvVar8);
      vVar7 = get_vertex(&this->neighbor);
      if (vVar6 != vVar7) break;
      pvVar8 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                            *)end.current._M_current);
      o = std::max<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>
                    (&this->neighbor,pvVar8);
      Sparse_distance_matrix<Params>::vertex_diameter_t::operator=(&this->neighbor,o);
      it = (value_type *)((long)&(it->current)._M_current + 1);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ::operator++(__x);
  } while( true );
}

Assistant:

bool has_next(bool all_cofacets = true) {
      for (auto &it0 = neighbor_it[0], &end0 = neighbor_end[0]; it0 != end0; ++it0) {
        neighbor = *it0;
        for (size_t idx = 1; idx < neighbor_it.size(); ++idx) {
          auto &it = neighbor_it[idx], end = neighbor_end[idx];
          while (get_vertex(*it) > get_vertex(neighbor))
            if (++it == end) return false;
          if (get_vertex(*it) != get_vertex(neighbor))
            goto continue_outer;
          else
            neighbor = std::max(neighbor, *it);
        }
        while (k > 0 && vertices[k - 1] > get_vertex(neighbor)) {
          if (!all_cofacets) return false;
          idx_below -= simplex_encoding(vertices[k - 1], k);
          idx_above += simplex_encoding(vertices[k - 1], k + 1);
          --k;
        }
        return true;
continue_outer:;
      }
      return false;
    }